

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableEnumFieldLiteGenerator::ImmutableEnumFieldLiteGenerator
          (ImmutableEnumFieldLiteGenerator *this,FieldDescriptor *descriptor,int messageBitIndex,
          int builderBitIndex,Context *context)

{
  _Rb_tree_header *p_Var1;
  ClassNameResolver *pCVar2;
  FieldGeneratorInfo *info;
  
  (this->super_ImmutableFieldLiteGenerator)._vptr_ImmutableFieldLiteGenerator =
       (_func_int **)&PTR__ImmutableEnumOneofFieldLiteGenerator_00424818;
  this->descriptor_ = descriptor;
  p_Var1 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->messageBitIndex_ = messageBitIndex;
  this->builderBitIndex_ = builderBitIndex;
  pCVar2 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar2;
  info = Context::GetFieldGeneratorInfo(context,descriptor);
  anon_unknown_4::SetEnumVariables
            (descriptor,messageBitIndex,builderBitIndex,info,this->name_resolver_,&this->variables_)
  ;
  return;
}

Assistant:

ImmutableEnumFieldLiteGenerator::
ImmutableEnumFieldLiteGenerator(const FieldDescriptor* descriptor,
                            int messageBitIndex,
                            int builderBitIndex,
                            Context* context)
  : descriptor_(descriptor), messageBitIndex_(messageBitIndex),
    builderBitIndex_(builderBitIndex),
    name_resolver_(context->GetNameResolver()) {
  SetEnumVariables(descriptor, messageBitIndex, builderBitIndex,
                   context->GetFieldGeneratorInfo(descriptor),
                   name_resolver_, &variables_);
}